

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

void testMatrix22ArrayConstructor(float (*a) [2])

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  int iVar2;
  
  auVar1._4_4_ = -(uint)((*a)[1] != 0.0);
  auVar1._0_4_ = -(uint)((*a)[0] != 1.0);
  auVar1._8_4_ = -(uint)(a[1][0] != 0.0);
  auVar1._12_4_ = -(uint)(a[1][1] != 1.0);
  iVar2 = movmskps(in_EAX,auVar1);
  if (iVar2 == 0) {
    return;
  }
  __assert_fail("m == IMATH_INTERNAL_NAMESPACE::M22f()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testMatrix.cpp"
                ,0x29,"void testMatrix22ArrayConstructor(const float (*)[2])");
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix22<T>::Matrix22 (
    const T a[2][2]) IMATH_NOEXCEPT
{
    // Function calls and aliasing issues can inhibit vectorization versus
    // straight assignment of data members, so instead of this:
    //     memcpy (x, a, sizeof (x));
    // we do this:
    x[0][0] = a[0][0];
    x[0][1] = a[0][1];
    x[1][0] = a[1][0];
    x[1][1] = a[1][1];
}